

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

idx_t __thiscall
duckdb::QuantileCursor<duckdb::date_t>::Seek(QuantileCursor<duckdb::date_t> *this,idx_t row_idx)

{
  DataChunk *result;
  reference pvVar1;
  ulong uVar2;
  
  uVar2 = (this->scan).current_row_index;
  if ((this->scan).next_row_index <= row_idx || row_idx < uVar2) {
    result = &this->page;
    ColumnDataCollection::Seek(this->inputs,row_idx,&this->scan,result);
    pvVar1 = vector<duckdb::Vector,_true>::get<true>(&result->data,0);
    this->data = (date_t *)pvVar1->data;
    pvVar1 = vector<duckdb::Vector,_true>::get<true>(&result->data,0);
    FlatVector::VerifyFlatVector(pvVar1);
    this->validity = &pvVar1->validity;
    uVar2 = (this->scan).current_row_index;
  }
  return (ulong)(uint)((int)row_idx - (int)uVar2);
}

Assistant:

inline idx_t Seek(idx_t row_idx) {
		if (!RowIsVisible(row_idx)) {
			inputs.Seek(row_idx, scan, page);
			data = FlatVector::GetData<INPUT_TYPE>(page.data[0]);
			validity = &FlatVector::Validity(page.data[0]);
		}
		return RowOffset(row_idx);
	}